

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

void __thiscall c4::yml::Parser::_prepare_locations(Parser *this)

{
  substr *this_00;
  code *pcVar1;
  Location LVar2;
  bool bVar3;
  size_t sVar4;
  ulong uVar5;
  ulong uVar6;
  size_t numnewlines;
  char msg [54];
  char local_68 [56];
  
  this_00 = &this->m_buf;
  sVar4 = (this->m_buf).len;
  (this->m_newline_offsets_buf).str = (this->m_buf).str;
  (this->m_newline_offsets_buf).len = sVar4;
  sVar4 = basic_substring<char>::first_of(this_00,'\n',0);
  numnewlines = 1;
  while (sVar4 != 0xffffffffffffffff) {
    sVar4 = basic_substring<char>::first_of(this_00,'\n',sVar4 + 1);
    numnewlines = numnewlines + 1;
  }
  _resize_locations(this,numnewlines);
  this->m_newline_offsets_size = 0;
  uVar5 = (this->m_buf).len;
  if (uVar5 != 0) {
    uVar6 = 0;
    do {
      if ((this->m_buf).len <= uVar6) {
        if (((s_error_flags & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
          pcVar1 = (code *)swi(3);
          (*pcVar1)();
          return;
        }
        handle_error(0x200e84,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                     ,0x14c3,"i >= 0 && i < len");
      }
      if (this_00->str[uVar6] == '\n') {
        sVar4 = this->m_newline_offsets_size;
        this->m_newline_offsets_size = sVar4 + 1;
        this->m_newline_offsets[sVar4] = uVar6;
      }
      uVar6 = uVar6 + 1;
      uVar5 = (this->m_buf).len;
    } while (uVar6 < uVar5);
  }
  sVar4 = this->m_newline_offsets_size;
  this->m_newline_offsets_size = sVar4 + 1;
  this->m_newline_offsets[sVar4] = uVar5;
  if (this->m_newline_offsets_size != numnewlines) {
    builtin_strncpy(local_68,"check failed: (m_newline_offsets_size == numnewlines)",0x36);
    if (((s_error_flags & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
      pcVar1 = (code *)swi(3);
      (*pcVar1)();
      return;
    }
    LVar2.super_LineCol.col = 0;
    LVar2.super_LineCol.offset = SUB168(ZEXT816(0x8052) << 0x40,0);
    LVar2.super_LineCol.line = SUB168(ZEXT816(0x8052) << 0x40,8);
    LVar2.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar2.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              (local_68,0x36,LVar2,(this->m_stack).m_callbacks.m_user_data);
  }
  return;
}

Assistant:

void Parser::_prepare_locations()
{
    m_newline_offsets_buf = m_buf;
    size_t numnewlines = 1u + m_buf.count('\n');
    _resize_locations(numnewlines);
    m_newline_offsets_size = 0;
    for(size_t i = 0; i < m_buf.len; i++)
        if(m_buf[i] == '\n')
            m_newline_offsets[m_newline_offsets_size++] = i;
    m_newline_offsets[m_newline_offsets_size++] = m_buf.len;
    _RYML_CB_ASSERT(m_stack.m_callbacks, m_newline_offsets_size == numnewlines);
}